

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall enact::StringExpr::~StringExpr(StringExpr *this)

{
  StringExpr *this_local;
  
  ~StringExpr(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~StringExpr() override = default;